

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256.cpp
# Opt level: O2

Node256 * duckdb::Node256::New(ART *art,Node *node)

{
  FixedSizeAllocator *this;
  IndexPointer IVar1;
  Node256 *pNVar2;
  long lVar3;
  Node ptr;
  
  this = Node::GetAllocator(art,NODE_256);
  IVar1 = FixedSizeAllocator::New(this);
  ptr.super_IndexPointer.data = (IndexPointer)(IVar1.data & 0xffffffffffffff | 0x600000000000000);
  (node->super_IndexPointer).data = (idx_t)ptr;
  pNVar2 = Node::Ref<duckdb::Node256>(art,ptr,NODE_256);
  pNVar2->count = 0;
  for (lVar3 = 1; lVar3 != 0x101; lVar3 = lVar3 + 1) {
    pNVar2->children[lVar3 + -1].super_IndexPointer.data = 0;
  }
  return pNVar2;
}

Assistant:

Node256 &Node256::New(ART &art, Node &node) {
	node = Node::GetAllocator(art, NODE_256).New();
	node.SetMetadata(static_cast<uint8_t>(NODE_256));
	auto &n256 = Node::Ref<Node256>(art, node, NODE_256);

	n256.count = 0;
	for (uint16_t i = 0; i < CAPACITY; i++) {
		n256.children[i].Clear();
	}

	return n256;
}